

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * __thiscall mkvparser::Segment::GetNext(Segment *this,Cluster *pCurr)

{
  Segment *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  long lVar3;
  Cluster **ppCVar4;
  Cluster **ppCVar5;
  Cluster *pCluster;
  ptrdiff_t idx_next;
  Cluster *pNext;
  Cluster *pNext_2;
  Cluster **k;
  Cluster **j;
  Cluster **jj;
  Cluster **i;
  Cluster **ii;
  long status;
  long len_;
  longlong pos_;
  longlong off_next_;
  longlong size_1;
  longlong id_1;
  longlong idpos;
  longlong result_1;
  long len_1;
  longlong off_next;
  longlong size;
  longlong id;
  longlong result;
  long len;
  longlong stop;
  longlong pos;
  Cluster *pNext_1;
  long idx;
  Cluster *pCurr_local;
  Segment *this_local;
  
  idx = (long)pCurr;
  pCurr_local = (Cluster *)this;
  if (pCurr == (Cluster *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9de,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  if (pCurr == &this->m_eos) {
    __assert_fail("pCurr != &m_eos",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9df,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  if (this->m_clusters == (Cluster **)0x0) {
    __assert_fail("m_clusters",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9e0,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  pNext_1 = (Cluster *)pCurr->m_index;
  if ((long)pNext_1 < 0) {
    if (this->m_clusterPreloadCount < 1) {
      __assert_fail("m_clusterPreloadCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9f6,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    stop = pCurr->m_element_start;
    if (this->m_size < 0) {
      __assert_fail("m_size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9fa,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    len = this->m_start + this->m_size;
    id = GetUIntLength(this->m_pReader,stop,&result);
    if (id != 0) {
      __assert_fail("result == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa01,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (len < stop + result) {
      __assert_fail("(pos + len) <= stop",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa02,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    size = ReadID(this->m_pReader,stop,&result);
    if (size == 0x1f43b675) {
      stop = result + stop;
      id = GetUIntLength(this->m_pReader,stop,&result);
      if (id != 0) {
        __assert_fail("result == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa0e,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (len < stop + result) {
        __assert_fail("(pos + len) <= stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa0f,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      off_next = ReadUInt(this->m_pReader,stop,&result);
      if (off_next < 1) {
        __assert_fail("size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa12,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      stop = result + stop;
      if (len < stop + off_next) {
        __assert_fail("(pos + size) <= stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa16,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      stop = off_next + stop;
      len_1 = 0;
      while (stop < len) {
        idpos = GetUIntLength(this->m_pReader,stop,&result_1);
        if (idpos != 0) {
          __assert_fail("result == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa23,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        if (len < stop + result_1) {
          __assert_fail("(pos + len) <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa24,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        id_1 = stop;
        size_1 = ReadID(this->m_pReader,stop,&result_1);
        if (size_1 < 0) {
          return (Cluster *)0x0;
        }
        stop = result_1 + stop;
        idpos = GetUIntLength(this->m_pReader,stop,&result_1);
        if (idpos != 0) {
          __assert_fail("result == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa32,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        if (len < stop + result_1) {
          __assert_fail("(pos + len) <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa33,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        off_next_ = ReadUInt(this->m_pReader,stop,&result_1);
        if (off_next_ < 0) {
          __assert_fail("size >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa36,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        stop = result_1 + stop;
        if (len < stop + off_next_) {
          __assert_fail("(pos + size) <= stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa39,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        if (off_next_ != 0) {
          if (size_1 == 0x1f43b675) {
            pos_ = id_1 - this->m_start;
            lVar3 = Cluster::HasBlockEntries(this,pos_,&len_,&status);
            if (lVar3 < 0) {
              __assert_fail("status >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa48,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            if (0 < lVar3) {
              len_1 = pos_;
              break;
            }
          }
          stop = off_next_ + stop;
        }
      }
      if (len_1 < 1) {
        this_local = (Segment *)0x0;
      }
      else {
        jj = this->m_clusters + this->m_clusterCount;
        ppCVar4 = jj + this->m_clusterPreloadCount;
        k = ppCVar4;
        do {
          while( true ) {
            if (k <= jj) {
              if (jj != k) {
                __assert_fail("i == j",
                              "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                              ,0xa77,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
              }
              pCluster = Cluster::Create(this,-1,len_1);
              if (pCluster == (Cluster *)0x0) {
                return (Cluster *)0x0;
              }
              lVar3 = (long)jj - (long)this->m_clusters >> 3;
              bVar2 = PreloadCluster(this,pCluster,lVar3);
              if (!bVar2) {
                if (pCluster != (Cluster *)0x0) {
                  Cluster::~Cluster(pCluster);
                  operator_delete(pCluster);
                }
                return (Cluster *)0x0;
              }
              if (this->m_clusters != (Cluster **)0x0) {
                if (this->m_clusterSize <= lVar3) {
                  __assert_fail("idx_next < m_clusterSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                ,0xa84,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)"
                               );
                }
                if (this->m_clusters[lVar3] == pCluster) {
                  return pCluster;
                }
                __assert_fail("m_clusters[idx_next] == pNext",
                              "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                              ,0xa85,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
              }
              __assert_fail("m_clusters",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa83,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            auVar1._8_8_ = (long)k - (long)jj >> 0x3f;
            auVar1._0_8_ = (long)k - (long)jj >> 3;
            ppCVar5 = jj + SUB168(auVar1 / SEXT816(2),0);
            if (ppCVar4 <= ppCVar5) {
              __assert_fail("k < jj",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa63,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            this_00 = (Segment *)*ppCVar5;
            if (this_00 == (Segment *)0x0) {
              __assert_fail("pNext",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa66,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            if (-1 < this_00->m_start) {
              __assert_fail("pNext->m_index < 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa67,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            stop = Cluster::GetPosition((Cluster *)this_00);
            if (len_1 <= stop) break;
            jj = ppCVar5 + 1;
          }
          k = ppCVar5;
          this_local = this_00;
        } while (len_1 < stop);
      }
    }
    else {
      this_local = (Segment *)0x0;
    }
  }
  else {
    if (this->m_clusterCount < 1) {
      __assert_fail("m_clusterCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e5,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (this->m_clusterCount <= (long)pNext_1) {
      __assert_fail("idx < m_clusterCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e6,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (pCurr != this->m_clusters[(long)pNext_1]) {
      __assert_fail("pCurr == m_clusters[idx]",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e7,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    pNext_1 = (Cluster *)((long)&pNext_1->m_pSegment + 1);
    if ((long)pNext_1 < this->m_clusterCount) {
      pos = (longlong)this->m_clusters[(long)pNext_1];
      if ((Segment *)pos == (Segment *)0x0) {
        __assert_fail("pNext",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9ef,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (((Segment *)pos)->m_start < 0) {
        __assert_fail("pNext->m_index >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9f0,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      this_local = (Segment *)pos;
      if ((Cluster *)((Segment *)pos)->m_start != pNext_1) {
        __assert_fail("pNext->m_index == idx",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9f1,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
    }
    else {
      this_local = (Segment *)&this->m_eos;
    }
  }
  return (Cluster *)this_local;
}

Assistant:

const Cluster* Segment::GetNext(const Cluster* pCurr) {
  assert(pCurr);
  assert(pCurr != &m_eos);
  assert(m_clusters);

  long idx = pCurr->m_index;

  if (idx >= 0) {
    assert(m_clusterCount > 0);
    assert(idx < m_clusterCount);
    assert(pCurr == m_clusters[idx]);

    ++idx;

    if (idx >= m_clusterCount)
      return &m_eos;  // caller will LoadCluster as desired

    Cluster* const pNext = m_clusters[idx];
    assert(pNext);
    assert(pNext->m_index >= 0);
    assert(pNext->m_index == idx);

    return pNext;
  }

  assert(m_clusterPreloadCount > 0);

  long long pos = pCurr->m_element_start;

  assert(m_size >= 0);  // TODO
  const long long stop = m_start + m_size;  // end of segment

  {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long id = ReadID(m_pReader, pos, len);
    if (id != libwebm::kMkvCluster)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size > 0);  // TODO
    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    pos += size;  // consume payload
  }

  long long off_next = 0;

  while (pos < stop) {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long idpos = pos;  // pos of next (potential) cluster

    const long long id = ReadID(m_pReader, idpos, len);
    if (id < 0)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size >= 0);  // TODO

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvCluster) {
      const long long off_next_ = idpos - m_start;

      long long pos_;
      long len_;

      const long status = Cluster::HasBlockEntries(this, off_next_, pos_, len_);

      assert(status >= 0);

      if (status > 0) {
        off_next = off_next_;
        break;
      }
    }

    pos += size;  // consume payload
  }

  if (off_next <= 0)
    return 0;

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    // const long long pos_ = pNext->m_pos;
    // assert(pos_);
    // pos = pos_ * ((pos_ < 0) ? -1 : 1);

    pos = pNext->GetPosition();

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else
      return pNext;
  }

  assert(i == j);

  Cluster* const pNext = Cluster::Create(this, -1, off_next);
  if (pNext == NULL)
    return NULL;

  const ptrdiff_t idx_next = i - m_clusters;  // insertion position

  if (!PreloadCluster(pNext, idx_next)) {
    delete pNext;
    return NULL;
  }
  assert(m_clusters);
  assert(idx_next < m_clusterSize);
  assert(m_clusters[idx_next] == pNext);

  return pNext;
}